

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O0

void __thiscall Molecules::MaterializeMoleculesForProvenance(Molecules *this,Molecules *M2)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false> local_20;
  iterator it;
  Molecules *M2_local;
  Molecules *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>)M2;
  std::
  unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  ::clear((unordered_map<unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           *)diplo::ProvIdx);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
       ::begin(&this->molecules);
  while( true ) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_Molecule,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_>_>
         ::end(&this->molecules);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_20);
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)
                        &local_20);
    Molecule::MaterializeMoleculesForProvenance
              (&ppVar2->second,ppVar3->first,
               (Molecules *)
               it.super__Node_iterator_base<std::pair<const_unsigned_long,_Molecule>,_false>._M_cur)
    ;
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_unsigned_long,_Molecule>,_false,_false> *)&local_20,0
              );
  }
  return;
}

Assistant:

void Molecules::MaterializeMoleculesForProvenance(Molecules &M2) {
	diplo::ProvIdx.clear();
	for (unordered_map<KEY_ID, Molecule >::iterator it = molecules.begin(); it != molecules.end(); it++) {
		it->second.MaterializeMoleculesForProvenance(it->first, M2);
	}
}